

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O0

int greatest_string_printf_cb(void *t,void *udata)

{
  int iVar1;
  void *udata_local;
  void *t_local;
  
  iVar1 = fprintf(_stdout,"%s",t);
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(weird_network);
    RUN_TEST(weird_network2);
    RUN_TEST(weird_network3);
    RUN_TEST(CLRS_network);
    RUN_TEST(non_trivial_network1);
    RUN_TEST(non_trivial_network2);
    RUN_TEST(non_trivial_network3);
    RUN_TEST(no_path_flow);
    RUN_TEST(single_path_flow);
    RUN_TEST(two_path_flow);
    RUN_TEST(random_networks);

    GREATEST_MAIN_END(); /* display results */
}